

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

int bhitpile(obj *obj,_func_int_obj_ptr_obj_ptr *fhito,int tx,int ty)

{
  ushort uVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  trap *trap;
  monst *pmVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  obj *poVar9;
  permonst *ptr;
  long lVar10;
  ulong uVar11;
  obj *poVar12;
  uint uVar13;
  
  if ((((obj->otyp == 0x1c4) || (obj->otyp == 0x187)) &&
      (trap = t_at(level,tx,ty), trap != (trap *)0x0)) &&
     ((((trap->field_0x8 & 0x1f) == 0x14 &&
       (pmVar5 = activate_statue_trap(trap,(xchar)tx,(xchar)ty,'\x01'), pmVar5 != (monst *)0x0)) &&
      (obj->otyp == 0x1c4)))) {
    discover_object(0x1c4,'\x01','\x01');
  }
  poly_zapped = -1;
  iVar8 = 0;
  poVar9 = level->objects[tx][ty];
  while (iVar3 = poly_zapped, poVar9 != (obj *)0x0) {
    poVar12 = (poVar9->v).v_nexthere;
    iVar3 = (*fhito)(poVar9,obj);
    iVar8 = iVar8 + iVar3;
    poVar9 = poVar12;
  }
  if (((poly_zapped < 0) || (poVar9 = level->objects[tx][ty], poVar9 == (obj *)0x0)) ||
     (((poVar9->v).v_nexthere == (obj *)0x0 && (poVar9->quan == 1)))) {
    return iVar8;
  }
  switch(poly_zapped) {
  case 0:
  case 4:
    lVar10 = 0x106;
    pcVar6 = "organic ";
    break;
  default:
    lVar10 = 0xff;
    pcVar6 = "";
    break;
  case 2:
    lVar10 = 0x101;
    pcVar6 = "wax ";
    break;
  case 5:
    lVar10 = 0x100;
    pcVar6 = "paper ";
    break;
  case 6:
    lVar10 = 0x102;
    pcVar6 = "cloth ";
    break;
  case 7:
    lVar10 = 0x104;
    pcVar6 = "leather ";
    break;
  case 8:
    lVar10 = 0x105;
    pcVar6 = "wood ";
    break;
  case 9:
    lVar10 = 0xfe;
    pcVar6 = "bony ";
    break;
  case 0xb:
  case 0xc:
  case 0x11:
    lVar10 = 0x10a;
    pcVar6 = "metal ";
    break;
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x14:
  case 0x15:
    uVar13 = mt_random();
    lVar10 = (ulong)(uVar13 & 1) + 0x107;
    pcVar6 = "lithic ";
    break;
  case 0xf:
    lVar10 = 0x103;
    pcVar6 = "gold ";
    break;
  case 0x13:
    lVar10 = 0x109;
    pcVar6 = "glassy ";
  }
  uVar11 = (ulong)(uint)((int)lVar10 << 6);
  ptr = (permonst *)((long)&((permonst *)(mons[0].mattk + -4))->mname + uVar11);
  if ((mvitals[lVar10].mvflags & 2) != 0) {
    ptr = (permonst *)0x0;
  }
  pmVar5 = makemon(ptr,level,(int)poVar9->ox,(int)poVar9->oy,0);
  uVar13 = (uint)*(ushort *)((long)(mons[0].mattk + 6) + uVar11);
  do {
    do {
      poVar12 = poVar9;
      if (((int)uVar13 < 1) || (poVar12 == (obj *)0x0)) {
        if (pmVar5 == (monst *)0x0) {
          return iVar8;
        }
        if ((viz_array[pmVar5->my][pmVar5->mx] & 2U) == 0) {
          return iVar8;
        }
        pcVar7 = a_monnam(pmVar5);
        pline("Some %sobjects meld, and %s arises from the pile!",pcVar6,pcVar7);
        return iVar8;
      }
      poVar9 = (poVar12->v).v_nexthere;
    } while ((((poVar12 == uball) || (poVar12 == uchain)) ||
             (bVar2 = obj_resists(poVar12,0,0), bVar2 != '\0')) ||
            (uVar1 = *(ushort *)&objects[poVar12->otyp].field_0x11, iVar4 = rn2(uVar13 + 1),
            (iVar4 == 0) == (iVar3 == (uVar1 >> 4 & 0x1f))));
    bVar2 = costly_spot(poVar12->ox,poVar12->oy);
    if (bVar2 != '\0') {
      if (u.ushops[0] == '\0') {
        stolen_value(poVar12,poVar12->ox,poVar12->oy,'\0','\0');
      }
      else {
        addtobill(poVar12,'\0','\0','\0');
      }
    }
    uVar13 = uVar13 - poVar12->quan;
    if (0x7ffe < poVar12->quan) {
      uVar13 = 0;
    }
    delobj(poVar12);
  } while( true );
}

Assistant:

int bhitpile(struct obj *obj, int (*fhito)(struct obj*,struct obj*),
	     int tx, int ty)
{
    int hitanything = 0;
    struct obj *otmp, *next_obj;

    if (obj->otyp == SPE_FORCE_BOLT || obj->otyp == WAN_STRIKING) {
	struct trap *t = t_at(level, tx, ty);

	/* We can't settle for the default calling sequence of
	   bhito(otmp) -> break_statue(otmp) -> activate_statue_trap(ox,oy)
	   because that last call might end up operating on our `next_obj'
	   (below), rather than on the current object, if it happens to
	   encounter a statue which mustn't become animated. */
	if (t && t->ttyp == STATUE_TRAP &&
	    activate_statue_trap(t, tx, ty, TRUE) && obj->otyp == WAN_STRIKING)
	    makeknown(obj->otyp);
    }

    poly_zapped = -1;
    for (otmp = level->objects[tx][ty]; otmp; otmp = next_obj) {
	/* Fix for polymorph bug, Tim Wright */
	next_obj = otmp->nexthere;
	hitanything += (*fhito)(otmp, obj);
    }
    if (poly_zapped >= 0)
	create_polymon(level->objects[tx][ty], poly_zapped);

    return hitanything;
}